

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerReflection::emit_resources(CompilerReflection *this)

{
  undefined1 local_1878 [8];
  ShaderResources res;
  CompilerReflection *this_local;
  
  res.builtin_outputs.stack_storage.aligned_char._440_8_ = this;
  Compiler::get_shader_resources((ShaderResources *)local_1878,(Compiler *)this);
  emit_resources(this,"subpass_inputs",
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.stage_outputs.stack_storage.aligned_char + 0x178));
  emit_resources(this,"inputs",
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.storage_buffers.stack_storage.aligned_char + 0x178));
  emit_resources(this,"outputs",
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.stage_inputs.stack_storage.aligned_char + 0x178));
  emit_resources(this,"textures",
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.storage_images.stack_storage.aligned_char + 0x178));
  emit_resources(this,"separate_images",
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.shader_record_buffers.stack_storage.aligned_char + 0x178));
  emit_resources(this,"separate_samplers",
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.separate_images.stack_storage.aligned_char + 0x178));
  emit_resources(this,"images",
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.subpass_inputs.stack_storage.aligned_char + 0x178));
  emit_resources(this,"ssbos",
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.uniform_buffers.stack_storage.aligned_char + 0x178));
  emit_resources(this,"ubos",(SmallVector<spirv_cross::Resource,_8UL> *)local_1878);
  emit_resources(this,"push_constants",
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.acceleration_structures.stack_storage.aligned_char + 0x178));
  emit_resources(this,"counters",
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.sampled_images.stack_storage.aligned_char + 0x178));
  emit_resources(this,"acceleration_structures",
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.atomic_counters.stack_storage.aligned_char + 0x178));
  ShaderResources::~ShaderResources((ShaderResources *)local_1878);
  return;
}

Assistant:

void CompilerReflection::emit_resources()
{
	auto res = get_shader_resources();
	emit_resources("subpass_inputs", res.subpass_inputs);
	emit_resources("inputs", res.stage_inputs);
	emit_resources("outputs", res.stage_outputs);
	emit_resources("textures", res.sampled_images);
	emit_resources("separate_images", res.separate_images);
	emit_resources("separate_samplers", res.separate_samplers);
	emit_resources("images", res.storage_images);
	emit_resources("ssbos", res.storage_buffers);
	emit_resources("ubos", res.uniform_buffers);
	emit_resources("push_constants", res.push_constant_buffers);
	emit_resources("counters", res.atomic_counters);
	emit_resources("acceleration_structures", res.acceleration_structures);
}